

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
mxx::gatherv<char>(vector<char,_std::allocator<char>_> *__return_storage_ptr__,char *data,
                  size_t size,int root,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  size_t local_38;
  
  local_38 = size;
  gather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,&local_38,root,comm)
  ;
  gatherv<char>(__return_storage_ptr__,data,local_38,
                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,root,comm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = gather(size, root, comm);
    return gatherv(data, size, recv_sizes, root, comm);
}